

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_buf.c
# Opt level: O0

zt_buf_t * zt_buf_new(void)

{
  zt_buf_t *b;
  size_t in_stack_fffffffffffffff0;
  zt_buf_t *local_8;
  
  local_8 = (zt_buf_t *)zt_malloc_p(in_stack_fffffffffffffff0);
  if (local_8 == (zt_buf_t *)0x0) {
    local_8 = (zt_buf_t *)0x0;
  }
  else {
    local_8->len = 0;
    local_8->max = 0;
    local_8->buf = (void *)0x0;
    local_8->top = (void *)0x0;
  }
  return local_8;
}

Assistant:

zt_buf_t *
zt_buf_new(void) {
    zt_buf_t * b;

    if (!(b = zt_malloc(zt_buf_t, 1))) {
        return NULL;
    }

    b->len = 0;
    b->max = 0;
    b->buf = NULL;
    b->top = NULL;

    return b;
}